

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O2

void __thiscall QObjectPrivate::ExtraData::~ExtraData(ExtraData *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&this->objectName);
  QArrayDataPointer<QPointer<QObject>_>::~QArrayDataPointer(&(this->eventFilters).d);
  QArrayDataPointer<Qt::TimerId>::~QArrayDataPointer(&(this->runningTimers).d);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&(this->propertyValues).d);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)this);
  return;
}

Assistant:

ExtraData(QObjectPrivate *ptr) : parent(ptr) { }